

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

void testRegexp(FILE *output,xmlRegexpPtr comp,char *value)

{
  uint uVar1;
  int ret;
  char *value_local;
  xmlRegexpPtr comp_local;
  FILE *output_local;
  
  uVar1 = xmlRegexpExec(comp,value);
  if (uVar1 == 1) {
    fprintf((FILE *)output,"%s: Ok\n",value);
  }
  else if (uVar1 == 0) {
    fprintf((FILE *)output,"%s: Fail\n",value);
  }
  else {
    fprintf((FILE *)output,"%s: Error: %d\n",value,(ulong)uVar1);
  }
  return;
}

Assistant:

static void testRegexp(FILE *output, xmlRegexpPtr comp, const char *value) {
    int ret;

    ret = xmlRegexpExec(comp, (const xmlChar *) value);
    if (ret == 1)
	fprintf(output, "%s: Ok\n", value);
    else if (ret == 0)
	fprintf(output, "%s: Fail\n", value);
    else
	fprintf(output, "%s: Error: %d\n", value, ret);
}